

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFDofsImport.cpp
# Opt level: O0

bool iDynTree::dofsListFromURDFString
               (string *urdf_string,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *dofs)

{
  byte bVar1;
  int iVar2;
  Model *pMVar3;
  ulong uVar4;
  long *plVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t jnt;
  Model model;
  bool ok;
  ModelLoader loader;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdf0;
  size_type in_stack_fffffffffffffdf8;
  ulong uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe00;
  allocator<char> *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  string local_1d0 [32];
  ulong local_1b0;
  Model local_1a8 [136];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  ModelLoader *in_stack_fffffffffffffef8;
  allocator<char> local_41;
  string local_40 [39];
  byte local_19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  ModelLoader::ModelLoader((ModelLoader *)in_stack_fffffffffffffe10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_8,(char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
             in_stack_fffffffffffffe10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x185a58);
  bVar1 = ModelLoader::loadModelFromString
                    (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                     in_stack_fffffffffffffee0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  local_19 = bVar1 & 1;
  pMVar3 = ModelLoader::model((ModelLoader *)0x185abe);
  iDynTree::Model::Model(local_1a8,pMVar3);
  local_1b0 = 0;
  while( true ) {
    uVar6 = local_1b0;
    uVar4 = iDynTree::Model::getNrOfJoints();
    if (uVar4 <= uVar6) break;
    plVar5 = (long *)iDynTree::Model::getJoint((long)local_1a8);
    iVar2 = (**(code **)(*plVar5 + 0x20))();
    if (iVar2 != 0) {
      this = local_10;
      iDynTree::Model::getJointName_abi_cxx11_((long)local_1d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this,(value_type *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      std::__cxx11::string::~string(local_1d0);
    }
    local_1b0 = local_1b0 + 1;
  }
  bVar1 = local_19;
  iDynTree::Model::~Model(local_1a8);
  ModelLoader::~ModelLoader((ModelLoader *)0x185c72);
  return (bool)(bVar1 & 1);
}

Assistant:

bool dofsListFromURDFString(const std::string & urdf_string,
                            std::vector<std::string>& dofs)
{
    // clear the vector
    dofs.resize(0);

    // Load a iDynTree::Model and dump the dofs name in the vector

    ModelLoader loader;
    bool ok = loader.loadModelFromString(urdf_string);
    iDynTree::Model model = loader.model();

    for(size_t jnt = 0; jnt < model.getNrOfJoints(); jnt++)
    {
        if( model.getJoint(jnt)->getNrOfDOFs() > 0 )
        {
            dofs.push_back(model.getJointName(jnt));
        }
    }

    return ok;
}